

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::MaxDrawBuffersIndexedTest::iterate
          (MaxDrawBuffersIndexedTest *this)

{
  undefined8 log_00;
  TestLog *log_01;
  RenderContext *renderContext;
  undefined1 local_198 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  drawBuffers;
  BlendState postCommonBlendState;
  BlendState preCommonBlendState;
  Random rng;
  allocator<char> local_89;
  string local_88;
  undefined1 local_68 [8];
  ResultCollector results;
  TestLog *log;
  MaxDrawBuffersIndexedTest *this_local;
  
  log_01 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  results.m_message.field_2._8_8_ = log_01;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_89);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_68,log_01,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  de::Random::Random((Random *)((long)&preCommonBlendState.colorMask.field_1 + 4),this->m_seed);
  BlendState::BlendState((BlendState *)&postCommonBlendState.colorMask.field_1);
  BlendState::BlendState
            ((BlendState *)
             &drawBuffers.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  ::vector((vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
            *)local_198);
  genRandomTest((Random *)((long)&preCommonBlendState.colorMask.field_1 + 4),
                (BlendState *)&postCommonBlendState.colorMask.field_1,
                (BlendState *)
                &drawBuffers.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                (vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                 *)local_198,4,(this->super_TestCase).m_context);
  log_00 = results.m_message.field_2._8_8_;
  renderContext = Context::getRenderContext((this->super_TestCase).m_context);
  anon_unknown_0::runTest
            ((TestLog *)log_00,(ResultCollector *)local_68,renderContext,
             (BlendState *)&postCommonBlendState.colorMask.field_1,
             (BlendState *)
             &drawBuffers.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
              *)local_198);
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_68,
             (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
             *)local_198);
  BlendState::~BlendState
            ((BlendState *)
             &drawBuffers.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  BlendState::~BlendState((BlendState *)&postCommonBlendState.colorMask.field_1);
  de::Random::~Random((Random *)((long)&preCommonBlendState.colorMask.field_1 + 4));
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_68);
  return STOP;
}

Assistant:

TestCase::IterateResult MaxDrawBuffersIndexedTest::iterate (void)
{
	TestLog&				log						= m_testCtx.getLog();
	tcu::ResultCollector	results					(log);
	de::Random				rng						(m_seed);
	BlendState				preCommonBlendState;
	BlendState				postCommonBlendState;
	vector<DrawBufferInfo>	drawBuffers;

	genRandomTest(rng, preCommonBlendState, postCommonBlendState, drawBuffers, 4, m_context);

	runTest(log, results, m_context.getRenderContext(), preCommonBlendState, postCommonBlendState, drawBuffers);

	results.setTestContextResult(m_testCtx);

	return STOP;
}